

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cpp
# Opt level: O1

void load_circuit(Circuit *C,string *location,bool verbose)

{
  ostream *poVar1;
  runtime_error *this;
  undefined7 in_register_00000011;
  ifstream inpf;
  long local_228 [4];
  byte abStack_208 [488];
  
  if ((int)CONCAT71(in_register_00000011,verbose) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Loading circuit from location ",0x1e);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(location->_M_dataplus)._M_p,
                        location->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  std::ifstream::ifstream(local_228,(string *)location,_S_in);
  if ((abStack_208[*(long *)(local_228[0] + -0x18)] & 5) == 0) {
    operator>>((istream *)local_228,C);
    std::ifstream::close();
    if (verbose) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Finished loading circuit",0x18);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
    }
    std::ifstream::~ifstream(local_228);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"file location");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void load_circuit(Circuit &C, const string &location, bool verbose = false) {
  if (verbose) {
    cout << "Loading circuit from location " << location << endl;
  }
  std::ifstream inpf(location);
  if (inpf.fail()) {
    throw std::runtime_error("file location");
  }
  inpf >> C;
  inpf.close();

  if (verbose) {
    cout << "Finished loading circuit" << endl;
  }
}